

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void arena_prepare_base_deletion_sync_finish(tsd_t *tsd,malloc_mutex_t **mutexes,uint n_mtx)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  malloc_mutex_t *pmVar3;
  int iVar4;
  ulong uVar5;
  mutex_prof_data_t *data;
  
  if (n_mtx != 0) {
    uVar5 = 0;
    do {
      pmVar3 = mutexes[uVar5];
      iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)&pmVar3->field_0 + 0x48));
      if (iVar4 != 0) {
        duckdb_je_malloc_mutex_lock_slow(pmVar3);
        (pmVar3->field_0).field_0.locked.repr = true;
      }
      puVar1 = &(pmVar3->field_0).field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if (&((pmVar3->field_0).field_0.prof_data.prev_owner)->tsd != tsd) {
        (pmVar3->field_0).field_0.prof_data.prev_owner = (tsdn_t *)tsd;
        ppwVar2 = &(pmVar3->field_0).witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
      pmVar3 = mutexes[uVar5];
      (pmVar3->field_0).field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar3->field_0 + 0x48));
      uVar5 = uVar5 + 1;
    } while (n_mtx != uVar5);
  }
  return;
}

Assistant:

static void
arena_prepare_base_deletion_sync_finish(tsd_t *tsd, malloc_mutex_t **mutexes,
    unsigned n_mtx) {
	for (unsigned i = 0; i < n_mtx; i++) {
		malloc_mutex_lock(tsd_tsdn(tsd), mutexes[i]);
		malloc_mutex_unlock(tsd_tsdn(tsd), mutexes[i]);
	}
}